

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ssh2.c
# Opt level: O0

int main(int argc,char **argv)

{
  in_addr_t iVar1;
  uint uVar2;
  int __fd;
  int iVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  uint local_6c;
  int retry;
  int retries;
  uint counter;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  int rc;
  char *userauthlist;
  char *fingerprint;
  sockaddr_in sin;
  int auth_pw;
  int i;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  sin.sin_zero[0] = '\0';
  sin.sin_zero[1] = '\0';
  sin.sin_zero[2] = '\0';
  sin.sin_zero[3] = '\0';
  channel = (LIBSSH2_CHANNEL *)0x0;
  pcVar4 = getenv("USER");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = getenv("LOGNAME");
    if (pcVar4 != (char *)0x0) {
      username = getenv("LOGNAME");
    }
  }
  else {
    username = getenv("USER");
  }
  pcVar4 = getenv("PRIVKEY");
  if (pcVar4 != (char *)0x0) {
    privkey = getenv("PRIVKEY");
  }
  pcVar4 = getenv("PUBKEY");
  if (pcVar4 != (char *)0x0) {
    pubkey = getenv("PUBKEY");
  }
  iVar1 = inet_addr(hostname);
  if (iVar1 == 0xffffffff) {
    fprintf(_stderr,"Failed to convert %s host address\n",hostname);
    return 1;
  }
  uVar2 = libssh2_init(0);
  if (uVar2 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
    return 1;
  }
  session._4_4_ = 1;
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fprintf(_stderr,"failed to create socket.\n");
  }
  else {
    fingerprint._0_2_ = 2;
    fingerprint._2_2_ = htons(0x1267);
    retry = 0;
    fingerprint._4_4_ = iVar1;
    while (((uint)retry < 3 && (iVar3 = connect(__fd,(sockaddr *)&fingerprint,0x10), iVar3 != 0))) {
      fprintf(_stderr,"Connection to %s:%d attempt #%d failed: retrying...\n",hostname,0x1267,
              (ulong)(uint)retry);
      portable_sleep(retry * 2 + 1);
      retry = retry + 1;
    }
    if (__fd == -1) {
      fprintf(_stderr,"Failed to connect to %s:%d\n",hostname,0x1267);
    }
    else {
      channel = (LIBSSH2_CHANNEL *)libssh2_session_init_ex(0,0,0);
      if (channel == (LIBSSH2_CHANNEL *)0x0) {
        fprintf(_stderr,"Could not initialize SSH session.\n");
      }
      else {
        pcVar4 = getenv("FIXTURE_TRACE_ALL_CONNECT");
        if ((pcVar4 != (char *)0x0) || (pcVar4 = getenv("FIXTURE_TRACE_ALL"), pcVar4 != (char *)0x0)
           ) {
          libssh2_trace(channel,0xffffffff);
          fprintf(_stdout,"Trace all enabled.\n");
        }
        libssh2_session_set_blocking(channel,1);
        local_6c = 0;
        while (uVar2 = libssh2_session_handshake(channel,__fd), uVar2 != 0) {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar2);
          local_6c = local_6c + 1;
          if (0 < (int)local_6c) break;
          fprintf(_stderr,"Retrying... %d / %d\n",(ulong)local_6c,0);
        }
        session._4_4_ = 1;
        lVar5 = libssh2_hostkey_hash(channel,2);
        fprintf(_stderr,"Fingerprint: ");
        sin.sin_zero[4] = '\0';
        sin.sin_zero[5] = '\0';
        sin.sin_zero[6] = '\0';
        sin.sin_zero[7] = '\0';
        for (; (int)sin.sin_zero._4_4_ < 0x14; sin.sin_zero._4_4_ = sin.sin_zero._4_4_ + 1) {
          fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + (int)sin.sin_zero._4_4_));
        }
        fprintf(_stderr,"\n");
        pcVar4 = username;
        sVar6 = strlen(username);
        pcVar4 = (char *)libssh2_userauth_list(channel,pcVar4,sVar6 & 0xffffffff);
        if (pcVar4 != (char *)0x0) {
          fprintf(_stderr,"Authentication methods: %s\n",pcVar4);
          pcVar7 = strstr(pcVar4,"password");
          if (pcVar7 != (char *)0x0) {
            sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 1;
          }
          pcVar7 = strstr(pcVar4,"keyboard-interactive");
          if (pcVar7 != (char *)0x0) {
            sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 2;
          }
          pcVar7 = strstr(pcVar4,"publickey");
          pcVar4 = username;
          if (pcVar7 != (char *)0x0) {
            sin.sin_zero._0_4_ = sin.sin_zero._0_4_ | 4;
          }
          if ((sin.sin_zero._0_4_ & 4) == 0) {
            fprintf(_stderr,"No supported authentication methods found.\n");
            goto LAB_00101927;
          }
          sVar6 = strlen(username);
          iVar3 = libssh2_userauth_publickey_fromfile_ex
                            (channel,pcVar4,sVar6 & 0xffffffff,pubkey,privkey,password);
          if (iVar3 != 0) {
            fprintf(_stderr,"Authentication by public key failed.\n");
            goto LAB_00101927;
          }
          fprintf(_stderr,"Authentication by public key succeeded.\n");
        }
        lVar5 = libssh2_channel_open_ex(channel,"session",7,0x200000,0x8000,0,0);
        if (lVar5 == 0) {
          fprintf(_stderr,"Unable to open a session\n");
        }
        else {
          libssh2_channel_setenv_ex(lVar5,"FOO",3,"bar");
          iVar3 = libssh2_channel_request_pty_ex(lVar5,"vanilla",7,0,0,0x50,0x18,0,0);
          if (iVar3 == 0) {
            iVar3 = libssh2_channel_process_startup(lVar5,"shell",5,0,0);
            if (iVar3 != 0) {
              fprintf(_stderr,"Unable to request shell on allocated pty\n");
              goto LAB_00101927;
            }
            session._4_4_ = 0;
          }
          else {
            fprintf(_stderr,"Failed requesting pty\n");
          }
          if (lVar5 != 0) {
            libssh2_channel_free(lVar5);
          }
        }
      }
    }
  }
LAB_00101927:
  if (channel != (LIBSSH2_CHANNEL *)0x0) {
    libssh2_session_disconnect_ex(channel,0xb,"Normal Shutdown","");
    libssh2_session_free(channel);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fprintf(_stderr,"all done\n");
  libssh2_exit();
  return session._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 0;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    unsigned int counter;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    (void)argc;
    (void)argv;

    #ifdef _WIN32
    #define LIBSSH2_FALLBACK_USER_ENV "USERNAME"
    #else
    #define LIBSSH2_FALLBACK_USER_ENV "LOGNAME"
    #endif

    if(getenv("USER"))
        username = getenv("USER");
    else if(getenv(LIBSSH2_FALLBACK_USER_ENV))
        username = getenv(LIBSSH2_FALLBACK_USER_ENV);

    if(getenv("PRIVKEY"))
        privkey = getenv("PRIVKEY");

    if(getenv("PUBKEY"))
        pubkey = getenv("PUBKEY");

    hostaddr = inet_addr(hostname);
    if(hostaddr == (uint32_t)(-1)) {
        fprintf(stderr, "Failed to convert %s host address\n", hostname);
        return 1;
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    rc = 1;

    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons((unsigned short)port_number);
    sin.sin_addr.s_addr = hostaddr;

    for(counter = 0; counter < 3; ++counter) {
        if(connect(sock, (struct sockaddr*)(&sin),
                   sizeof(struct sockaddr_in))) {
            fprintf(stderr,
                    "Connection to %s:%d attempt #%d failed: retrying...\n",
                    hostname, port_number, counter);
            portable_sleep(1 + 2*counter);
        }
        else {
            break;
        }
    }
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "Failed to connect to %s:%d\n",
                hostname, port_number);
        goto shutdown;
    }

    /* Create a session instance and start it up. This will trade welcome
     * banners, exchange keys, and setup crypto, compression, and MAC layers
     */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    if(getenv("FIXTURE_TRACE_ALL_CONNECT") ||
       getenv("FIXTURE_TRACE_ALL")) {
        libssh2_trace(session, ~0);
        fprintf(stdout, "Trace all enabled.\n");
    }

    libssh2_session_set_blocking(session, 1);

    {
        int retries = 0, retry = 0;
#ifdef LIBSSH2_WINCNG
        /* FIXME: Retry tests with WinCNG due to flakiness in hostkey
           verification: https://github.com/libssh2/libssh2/issues/804 */
        retries += 2;
#endif
        do {
            rc = libssh2_session_handshake(session, sock);
            if(rc == 0) {
                break;
            }
            fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
            if(
#ifdef LIBSSH2_WINCNG
               rc != LIBSSH2_ERROR_KEY_EXCHANGE_FAILURE ||
#endif
               ++retry > retries) {
                break;
            }
            fprintf(stderr, "Retrying... %d / %d\n", retry, retries);
        } while(1);
    }

    rc = 1;

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password")) {
            auth_pw |= 1;
        }
        if(strstr(userauthlist, "keyboard-interactive")) {
            auth_pw |= 2;
        }
        if(strstr(userauthlist, "publickey")) {
            auth_pw |= 4;
        }

        if(auth_pw & 4) {
            /* Authenticate by public key */
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found.\n");
            goto shutdown;
        }
    }

    /* Request a session channel on which to run a shell */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Unable to open a session\n");
        goto shutdown;
    }

    /* Some environment variables may be set,
     * It's up to the server which ones it'll allow though
     */
    libssh2_channel_setenv(channel, "FOO", "bar");

    /* Request a terminal with 'vanilla' terminal emulation
     * See /etc/termcap for more options. This is useful when opening
     * an interactive shell.
     */
    if(libssh2_channel_request_pty(channel, "vanilla")) {
        fprintf(stderr, "Failed requesting pty\n");
        goto skip_shell;
    }

    /* Open a SHELL on that pty */
    if(libssh2_channel_shell(channel)) {
        fprintf(stderr, "Unable to request shell on allocated pty\n");
        goto shutdown;
    }

    rc = 0;

skip_shell:

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2 /* SHUT_RDWR */);
#ifdef _WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return rc;
}